

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O2

Ptr __thiscall TgBot::Api::getFile(Api *this,string *fileId)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar1;
  allocator local_79;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> args;
  string local_60;
  ptree local_40;
  
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.super__Vector_base<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::reserve(&args,1);
  std::vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>>::
  emplace_back<char_const(&)[8],std::__cxx11::string_const&>
            ((vector<TgBot::HttpReqArg,std::allocator<TgBot::HttpReqArg>> *)&args,
             (char (*) [8])0x2735be,in_RDX);
  std::__cxx11::string::string((string *)&local_60,"getFile",&local_79);
  sendRequest(&local_40,(Api *)fileId,&local_60,&args);
  TgTypeParser::parseJsonAndGetFile((TgTypeParser *)this,(ptree *)&fileId[1]._M_string_length);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&args);
  PVar1.super___shared_ptr<TgBot::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<TgBot::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar1.super___shared_ptr<TgBot::File,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

File::Ptr Api::getFile(const string &fileId) const {
    vector<HttpReqArg> args;
    args.reserve(1);
    args.emplace_back("file_id", fileId);
    return _tgTypeParser.parseJsonAndGetFile(sendRequest("getFile", args));
}